

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

void Exa3_ManPrintSolution(Exa3_Man_t_conflict *p,int fCompl)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVarStart;
  int Val;
  int iVar;
  int k;
  int i;
  int fCompl_local;
  Exa3_Man_t_conflict *p_local;
  
  printf("Realization of given %d-input function using %d %d-input LUTs:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes,(ulong)(uint)p->nLutSize);
  iVar = p->nObjs;
  while (iVar = iVar + -1, p->nVars <= iVar) {
    iVar1 = p->LutMask;
    iVar2 = p->nVars;
    printf("%02d = %d\'b",(ulong)(uint)iVar,(ulong)(uint)(1 << ((byte)p->nLutSize & 0x1f)));
    Val = p->LutMask;
    while (Val = Val + -1, -1 < Val) {
      uVar3 = sat_solver_var_value(p->pSat,iVar1 * (iVar - iVar2) + 1 + Val);
      if ((iVar == p->nObjs + -1) && (fCompl != 0)) {
        printf("%d",(ulong)((uVar3 != 0 ^ 0xffU) & 1));
      }
      else {
        printf("%d",(ulong)uVar3);
      }
    }
    if ((iVar == p->nObjs + -1) && (fCompl != 0)) {
      printf("1(");
    }
    else {
      printf("0(");
    }
    Val = p->nLutSize;
    while (Val = Val + -1, -1 < Val) {
      uVar3 = Exa3_ManFindFanin(p,iVar,Val);
      if (((int)uVar3 < 0) || (p->nVars <= (int)uVar3)) {
        printf(" %02d",(ulong)uVar3);
      }
      else {
        printf(" %c",(ulong)(uVar3 + 0x61));
      }
    }
    printf(" )\n");
  }
  return;
}

Assistant:

static void Exa3_ManPrintSolution( Exa3_Man_t * p, int fCompl )
{
    int i, k, iVar;
    printf( "Realization of given %d-input function using %d %d-input LUTs:\n", p->nVars, p->nNodes, p->nLutSize );
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        int Val, iVarStart = 1 + p->LutMask*(i - p->nVars);
        printf( "%02d = %d\'b", i, 1 << p->nLutSize );
        for ( k = p->LutMask - 1; k >= 0; k-- )
        {
            Val = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+k); 
            if ( i == p->nObjs - 1 && fCompl )
                printf( "%d", !Val );
            else
                printf( "%d", Val );
        }
        if ( i == p->nObjs - 1 && fCompl )
            printf( "1(" );
        else
            printf( "0(" );

        for ( k = p->nLutSize - 1; k >= 0; k-- )
        {
            iVar = Exa3_ManFindFanin( p, i, k );
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}